

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_feof(Context *context,IntrinsicResult partialResult)

{
  ValueType VVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  ListStorage<MiniScript::TACLine> *pLVar3;
  int iVar4;
  long *plVar5;
  undefined4 *puVar6;
  Value fileWrapper;
  Value self;
  Value local_68;
  long *local_58;
  char local_50;
  undefined1 local_48 [16];
  Value local_38 [2];
  
  local_50 = '\0';
  plVar5 = (long *)operator_new(0x30);
  plVar5[1] = 1;
  *plVar5 = (long)&PTR__StringStorage_001d10b0;
  plVar5[3] = 5;
  plVar5[4] = -1;
  puVar6 = (undefined4 *)operator_new__(5);
  plVar5[2] = (long)puVar6;
  *(undefined1 *)(puVar6 + 1) = 0;
  *puVar6 = 0x666c6573;
  local_58 = plVar5;
  MiniScript::Context::GetVar
            ((Context *)local_48,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (long *)0x0) && (local_50 == '\0')) {
    plVar5 = local_58 + 1;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (**(code **)(*local_58 + 8))();
    }
    local_58 = (long *)0x0;
  }
  aVar2 = _handle.data;
  VVar1 = _handle.type;
  if ((Temp < _handle.type) && (_handle.data.ref != (RefCountedStorage *)0x0)) {
    (_handle.data.ref)->refCount = (_handle.data.ref)->refCount + 1;
  }
  MiniScript::Value::Lookup(&local_68,(Value *)local_48);
  if ((Temp < VVar1) && (aVar2.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(aVar2.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(aVar2.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if (local_68.type == Handle) {
    if ((FILE *)local_68.data.ref[1]._vptr_RefCountedStorage != (FILE *)0x0) {
      iVar4 = feof((FILE *)local_68.data.ref[1]._vptr_RefCountedStorage);
      MiniScript::Value::Truth(local_38,iVar4 != 0);
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      MiniScript::Value::operator=
                ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                 local_38);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_38[0].type) && (local_38[0].data.ref != (RefCountedStorage *)0x0)) {
        plVar5 = &(local_38[0].data.ref)->refCount;
        *plVar5 = *plVar5 + -1;
        if (*plVar5 == 0) {
          (*(local_38[0].data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_38[0].data.number = 0.0;
      }
      goto LAB_00133af7;
    }
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  else {
    MiniScript::IntrinsicResult::ensureStorage
              ((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  }
  pLVar3 = MiniScript::IntrinsicResult::Null;
  (context->code).ls = MiniScript::IntrinsicResult::Null;
  if (pLVar3 != (ListStorage<MiniScript::TACLine> *)0x0) {
    plVar5 = &(pLVar3->super_RefCountedStorage).refCount;
    *plVar5 = *plVar5 + 1;
  }
LAB_00133af7:
  if ((Temp < local_68.type) && (local_68.data.ref != (RefCountedStorage *)0x0)) {
    plVar5 = &(local_68.data.ref)->refCount;
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(local_68.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_68.data.number = 0.0;
  }
  if ((Temp < local_48[0]) && ((RefCountedStorage *)local_48._8_8_ != (RefCountedStorage *)0x0)) {
    plVar5 = (long *)(local_48._8_8_ + 8);
    *plVar5 = *plVar5 + -1;
    if (*plVar5 == 0) {
      (*(*(_func_int ***)local_48._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_feof(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	
	Value fileWrapper = self.Lookup(_handle);
	if (fileWrapper.IsNull() or fileWrapper.type != ValueType::Handle) return IntrinsicResult::Null;
	FileHandleStorage *storage = (FileHandleStorage*)fileWrapper.data.ref;
	FILE *handle = storage->f;
	if (handle == nullptr) return IntrinsicResult::Null;

	// Note: feof returns true only after attempting to read PAST the end of the file.
	// Not after the last successful read.  See: https://stackoverflow.com/questions/34888776
	return IntrinsicResult(Value::Truth(feof(handle) != 0));
}